

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O2

_Bool rcnb_decode_byte(wchar_t *value_in,char **value_out)

{
  wchar_t target;
  wchar_t target_00;
  char *pcVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint uVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  unsigned_short uVar8;
  
  target = *value_in;
  wVar2 = find(L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ",0xf,target);
  uVar8 = 0xf;
  target_00 = value_in[1];
  wVar3 = find(L"cCĆćĈĉĊċČčƇƈÇȻȼ",0xf,target_00);
  uVar7 = wVar2 | wVar3;
  if ((int)uVar7 < 0) {
    wVar2 = find(L"nNŃńŅņŇňƝƞÑǸǹȠȵ",0xf,target);
    wVar3 = find(L"bBƀƁƃƄƅßÞþ",10,target_00);
  }
  _Var5 = false;
  if ((L'\xffffffff' < wVar2) && (_Var5 = false, L'\xffffffff' < wVar3)) {
    if ((int)uVar7 < 0) {
      uVar8 = 10;
    }
    uVar6 = wVar2 * (uint)uVar8 + wVar3;
    if (uVar6 < 0x80) {
      uVar4 = (uint)(byte)((byte)uVar6 | 0x80);
      if (-1 < (int)uVar7) {
        uVar4 = uVar6;
      }
      pcVar1 = *value_out;
      *value_out = pcVar1 + 1;
      *pcVar1 = (char)uVar4;
      _Var5 = true;
    }
    else {
      _Var5 = false;
    }
  }
  return _Var5;
}

Assistant:

bool rcnb_decode_byte(const wchar_t* value_in, char** value_out)
{
    bool nb = false;
    int idx[2] = { find(cr, sr, *value_in), find(cc, sc, *(value_in + 1)) };
    if (idx[0] < 0 || idx[1] < 0) {
        idx[0] = find(cn, sn, *value_in);
        idx[1] = find(cb, sb, *(value_in + 1));
        nb = true;
    }
    if (idx[0] < 0 || idx[1] < 0)
        return false;
    int result = nb ? idx[0] * sb + idx[1] : idx[0] * sc + idx[1];
    if (result > 0x7F)
        return false;
    *(*value_out)++ = (char)(nb ? result | 0x80 : result);
    return true;
}